

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O1

void trt_pose::parse::subMinRow(float *cost_graph,int M,int nrows,int ncols)

{
  ulong uVar1;
  float *pfVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  if (0 < nrows) {
    uVar1 = 0;
    pfVar2 = cost_graph;
    do {
      fVar4 = cost_graph[uVar1 * (long)M];
      if (0 < ncols) {
        uVar3 = 0;
        fVar5 = fVar4;
        do {
          fVar4 = pfVar2[uVar3];
          if (fVar5 <= pfVar2[uVar3]) {
            fVar4 = fVar5;
          }
          uVar3 = uVar3 + 1;
          fVar5 = fVar4;
        } while ((uint)ncols != uVar3);
      }
      if (0 < ncols) {
        uVar3 = 0;
        do {
          pfVar2[uVar3] = pfVar2[uVar3] - fVar4;
          uVar3 = uVar3 + 1;
        } while ((uint)ncols != uVar3);
      }
      uVar1 = uVar1 + 1;
      pfVar2 = pfVar2 + M;
    } while (uVar1 != (uint)nrows);
  }
  return;
}

Assistant:

void subMinRow(float *cost_graph, const int M, const int nrows,
               const int ncols) {
  for (int i = 0; i < nrows; i++) {
    // find min
    float min = cost_graph[i * M];
    for (int j = 0; j < ncols; j++) {
      float val = cost_graph[i * M + j];
      if (val < min) {
        min = val;
      }
    }

    // subtract min
    for (int j = 0; j < ncols; j++) {
      cost_graph[i * M + j] -= min;
    }
  }
}